

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_triag_mesh_builder.cc
# Opt level: O3

shared_ptr<lf::mesh::Mesh> __thiscall
lf::mesh::utils::TPTriagMeshBuilder::Build(TPTriagMeshBuilder *this)

{
  long *plVar1;
  undefined1 auVar2 [16];
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  long lVar3;
  undefined4 extraout_EAX;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  DstEvaluatorType dstEvaluator;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *pCVar8;
  double *pdVar9;
  CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *pCVar10;
  TriaO1 *pTVar11;
  TriaO1 *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  uint uVar13;
  long in_RSI;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  shared_ptr<lf::mesh::Mesh> sVar17;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string_view_t fmt_02;
  string_view_t fmt_03;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  int edge_cnt;
  value_type first_endpoint_idx;
  value_type second_endpoint_idx;
  Matrix<double,__1,_3,_0,__1,_3> tria_geo_up;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_index_list_low;
  Matrix<double,__1,_3,_0,__1,_3> tria_geo_low;
  int node_cnt;
  Matrix<double,__1,_2,_0,__1,_2> edge_geo;
  uint no_of_vertices;
  uint no_of_edges;
  uint no_of_cells;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v_idx;
  int local_1dc;
  TriaO1 *local_1d8;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_1d0;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  DenseStorage<double,__1,__1,_3,_0> local_198;
  undefined **local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  ulong local_160;
  ulong local_158;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  DenseStorage<double,__1,__1,_3,_0> local_138;
  double local_128;
  int local_11c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_100;
  long local_f8;
  undefined **local_f0;
  double local_e8;
  double dStack_e0;
  double local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  undefined4 *local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  ulong local_68;
  ulong local_60;
  double local_58;
  TPTriagMeshBuilder *local_50;
  long local_48;
  double local_40;
  double local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  
  uVar13 = *(uint *)(in_RSI + 0x30);
  local_160 = (ulong)uVar13;
  uVar5 = *(uint *)(in_RSI + 0x34);
  local_158 = (ulong)uVar5;
  local_bc = uVar13 * uVar5 * 2;
  local_c0 = (uVar5 + 1) * uVar13 + (uVar13 * 2 + 1) * uVar5;
  local_c4 = (uVar5 + 1) * (uVar13 + 1);
  Logger();
  local_1d0.m_xpr = (Matrix<double,__1,_2,_0,__1,_2> *)0x355c7c;
  local_1d0.m_row = CONCAT44(local_1d0.m_row._4_4_,0x1d);
  local_1d0.m_col = 0x355b80;
  loc._8_8_ = local_1d0.m_row;
  loc.filename = 
  "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
  ;
  loc.funcname = "Build";
  fmt.size_ = 0x27;
  fmt.data_ = "TPmesh: {} cells, {} edges, {} vertices";
  spdlog::logger::log_<unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>
            (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             loc,debug,fmt,&local_bc,&local_c0,&local_c4);
  _Var12._M_pi = extraout_RDX;
  if (local_bc == 0) {
    (this->super_StructuredMeshBuilder)._vptr_StructuredMeshBuilder = (_func_int **)0x0;
    (this->super_StructuredMeshBuilder).mesh_factory_._M_t.
    super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
  }
  else {
    local_78 = *(double *)(in_RSI + 0x20) - *(double *)(in_RSI + 0x10);
    dStack_e0 = *(double *)(in_RSI + 0x28) - *(double *)(in_RSI + 0x18);
    auVar2._8_4_ = (int)-(ulong)(dStack_e0 <= 0.0);
    auVar2._0_8_ = -(ulong)(local_78 <= 0.0);
    auVar2._12_4_ = (int)(-(ulong)(dStack_e0 <= 0.0) >> 0x20);
    iVar4 = movmskpd(extraout_EAX,auVar2);
    if (iVar4 == 0) {
      local_78 = local_78 / (double)(local_160 & 0xffffffff);
      local_e8 = dStack_e0 / (double)(local_158 & 0xffffffff);
      dStack_70 = dStack_e0;
      local_50 = this;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_a0,(ulong)local_c4,(allocator_type *)&local_1d0);
      local_11c = 0;
      uVar13 = 0;
      do {
        local_180 = (undefined **)CONCAT44(local_180._4_4_,uVar13);
        local_1b0 = (double)uVar13 * local_e8;
        uVar13 = 0;
        do {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_b8,2);
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((double)uVar13 * local_78 + *(double *)(in_RSI + 0x10));
          local_1d0.m_row = 0;
          local_1d0.m_col = 1;
          local_1d0.m_currentBlockRows = 1;
          local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(*(double *)(in_RSI + 0x18) + local_1b0);
          local_1d0.m_xpr = (Matrix<double,__1,_2,_0,__1,_2> *)&local_b8;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_1d0,
                     (Scalar *)&local_178);
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_1d0);
          Logger();
          local_1d0.m_xpr = (Matrix<double,__1,_2,_0,__1,_2> *)0x355c7c;
          local_1d0.m_row = CONCAT44(local_1d0.m_row._4_4_,0x38);
          local_1d0.m_col = 0x355b80;
          loc_00._8_8_ = local_1d0.m_row;
          loc_00.filename =
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
          ;
          loc_00.funcname = "Build";
          fmt_00.size_ = 0x14;
          fmt_00.data_ = "Adding vertex {}: {}";
          local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_b8;
          spdlog::logger::log_<int&,Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
                    (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,loc_00,trace,fmt_00,&local_11c,
                     (Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_178);
          plVar1 = *(long **)(in_RSI + 8);
          local_88 = (undefined4 *)0x0;
          uStack_80 = 0;
          local_88 = (undefined4 *)Eigen::internal::aligned_malloc(0x10);
          uStack_80 = 2;
          *local_88 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_;
          local_88[1] = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_;
          local_88[2] = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_4_;
          local_88[3] = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_;
          uVar5 = (**(code **)(*plVar1 + 0x10))(plVar1,&local_88);
          local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[local_11c] = uVar5;
          free(local_88);
          uVar13 = uVar13 + 1;
          local_11c = local_11c + 1;
        } while (uVar13 <= (uint)local_160);
        uVar13 = (uint)local_180 + 1;
      } while (uVar13 <= (uint)local_158);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_b8,(ulong)local_c0,(allocator_type *)&local_1d0);
      local_1dc = 0;
      if ((uint)local_160 != 0) {
        uVar14 = 0;
        local_f0 = &PTR_DimLocal_003cfcc0;
        local_48 = in_RSI;
        do {
          local_180 = (undefined **)(ulong)((int)uVar14 + 1);
          local_1a8 = (double)uVar14 * local_78;
          local_128 = (double)(long)local_180 * local_78;
          uVar13 = 0;
          do {
            lVar3 = local_48;
            iVar4 = (*(int *)(local_48 + 0x30) + 1) * uVar13;
            local_1d8 = (TriaO1 *)
                        CONCAT44(local_1d8._4_4_,
                                 local_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(uint)(iVar4 + (int)uVar14)]);
            local_1a0 = (double)CONCAT44(local_1a0._4_4_,
                                         local_a0.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [iVar4 + (uint)local_180]);
            Logger();
            local_1d0.m_xpr = (Matrix<double,__1,_2,_0,__1,_2> *)0x355c7c;
            local_1d0.m_row = CONCAT44(local_1d0.m_row._4_4_,0x4b);
            local_1d0.m_col = 0x355b80;
            loc_01._8_8_ = local_1d0.m_row;
            loc_01.filename =
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
            ;
            loc_01.funcname = "Build";
            fmt_01.size_ = 0x1d;
            fmt_01.data_ = "horizontal edge {}: {} <-> {}";
            spdlog::logger::log_<int&,unsigned_int&,unsigned_int&>
                      (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,loc_01,trace,fmt_01,&local_1dc,(uint *)&local_1d8,(uint *)&local_1a0)
            ;
            local_1d0.m_xpr =
                 (Matrix<double,__1,_2,_0,__1,_2> *)CONCAT44(local_1a0._0_4_,(int)local_1d8);
            __l._M_len = 2;
            __l._M_array = (iterator)&local_1d0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_178,__l,(allocator_type *)&local_118);
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&local_118,2,2);
            local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(*(double *)(lVar3 + 0x10) + local_1a8);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::CommaInitializer
                      (&local_1d0,(Matrix<double,__1,_2,_0,__1,_2> *)&local_118,(Scalar *)&local_150
                      );
            local_198.m_data = (double *)(*(double *)(lVar3 + 0x10) + local_128);
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                               (&local_1d0,(Scalar *)&local_198);
            local_1b0 = (double)uVar13 * local_e8;
            local_138.m_data = (double *)(*(double *)(lVar3 + 0x18) + local_1b0);
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                               (pCVar8,(Scalar *)&local_138);
            local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        (local_1b0 + *(double *)(lVar3 + 0x18));
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                      (pCVar8,(Scalar *)&local_100);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_1d0);
            plVar1 = *(long **)(lVar3 + 8);
            local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_178.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_178.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2);
            local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pdVar9 = (double *)operator_new(0x18);
            Eigen::DenseStorage<double,_-1,_-1,_2,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_2,_0> *)&local_1d0,
                       (DenseStorage<double,__1,__1,_2,_0> *)&local_118);
            *pdVar9 = (double)local_f0;
            pdVar9[1] = (double)local_1d0.m_xpr;
            pdVar9[2] = (double)local_1d0.m_row;
            local_198.m_data = pdVar9;
            uVar5 = (**(code **)(*plVar1 + 0x20))(plVar1,2,&local_150,&local_198);
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[local_1dc] = uVar5;
            if (local_198.m_data != (double *)0x0) {
              (**(code **)((long)*local_198.m_data + 0x58))();
            }
            free(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
            if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              operator_delete(local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            uVar13 = uVar13 + 1;
            local_1dc = local_1dc + 1;
          } while (uVar13 <= (uint)local_158);
          uVar14 = (ulong)local_180 & 0xffffffff;
          in_RSI = local_48;
        } while ((int)local_180 != (uint)local_160);
      }
      local_1a8 = (double)((ulong)local_1a8 & 0xffffffff00000000);
      local_180 = &PTR_DimLocal_003cfcc0;
      do {
        if ((uint)local_158 != 0) {
          local_1b0 = (double)((ulong)local_1a8 & 0xffffffff) * local_78;
          uVar13 = 0;
          do {
            iVar4 = *(int *)(in_RSI + 0x30) + 1;
            local_1d8 = (TriaO1 *)
                        CONCAT44(local_1d8._4_4_,
                                 local_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [iVar4 * uVar13 + local_1a8._0_4_]);
            uVar5 = uVar13 + 1;
            local_1a0 = (double)CONCAT44(local_1a0._4_4_,
                                         local_a0.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [iVar4 * uVar5 + local_1a8._0_4_]);
            Logger();
            local_1d0.m_xpr = (Matrix<double,__1,_2,_0,__1,_2> *)0x355c7c;
            local_1d0.m_row = CONCAT44(local_1d0.m_row._4_4_,0x61);
            local_1d0.m_col = 0x355b80;
            loc_02._8_8_ = local_1d0.m_row;
            loc_02.filename =
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
            ;
            loc_02.funcname = "Build";
            fmt_02.size_ = 0x1b;
            fmt_02.data_ = "vertical edge {}: {} <-> {}";
            spdlog::logger::log_<int&,unsigned_int_const&,unsigned_int_const&>
                      (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,loc_02,trace,fmt_02,&local_1dc,(uint *)&local_1d8,(uint *)&local_1a0)
            ;
            local_1d0.m_xpr =
                 (Matrix<double,__1,_2,_0,__1,_2> *)CONCAT44(local_1a0._0_4_,(int)local_1d8);
            __l_00._M_len = 2;
            __l_00._M_array = (iterator)&local_1d0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_178,__l_00,(allocator_type *)&local_118);
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&local_118,2,2);
            local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(*(double *)(in_RSI + 0x10) + local_1b0);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::CommaInitializer
                      (&local_1d0,(Matrix<double,__1,_2,_0,__1,_2> *)&local_118,(Scalar *)&local_150
                      );
            local_198.m_data = (double *)(*(double *)(in_RSI + 0x10) + local_1b0);
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                               (&local_1d0,(Scalar *)&local_198);
            local_138.m_data = (double *)((double)uVar13 * local_e8 + *(double *)(in_RSI + 0x18));
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                               (pCVar8,(Scalar *)&local_138);
            local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((double)uVar5 * local_e8 + *(double *)(in_RSI + 0x18));
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                      (pCVar8,(Scalar *)&local_100);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_1d0);
            plVar1 = *(long **)(in_RSI + 8);
            local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_178.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_178.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2);
            local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pdVar9 = (double *)operator_new(0x18);
            Eigen::DenseStorage<double,_-1,_-1,_2,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_2,_0> *)&local_1d0,
                       (DenseStorage<double,__1,__1,_2,_0> *)&local_118);
            *pdVar9 = (double)local_180;
            pdVar9[1] = (double)local_1d0.m_xpr;
            pdVar9[2] = (double)local_1d0.m_row;
            local_198.m_data = pdVar9;
            uVar13 = (**(code **)(*plVar1 + 0x20))(plVar1,2,&local_150,&local_198);
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[local_1dc] = uVar13;
            if (local_198.m_data != (double *)0x0) {
              (**(code **)((long)*local_198.m_data + 0x58))();
            }
            free(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
            if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
              operator_delete(local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_1dc = local_1dc + 1;
            uVar13 = uVar5;
          } while ((uint)local_158 != uVar5);
        }
        uVar13 = local_1a8._0_4_ + 1;
        local_1a8 = (double)CONCAT44(local_1a8._4_4_,uVar13);
      } while (uVar13 <= (uint)local_160);
      if ((uint)local_160 != 0) {
        uVar13 = 0;
        do {
          local_1b0 = (double)CONCAT44(local_1b0._4_4_,uVar13 + 1);
          if ((uint)local_158 != 0) {
            local_1a8 = (double)uVar13 * local_78;
            local_128 = (double)(uVar13 + 1) * local_78;
            uVar5 = 0;
            do {
              iVar4 = *(int *)(in_RSI + 0x30) + 1;
              local_1d8 = (TriaO1 *)
                          CONCAT44(local_1d8._4_4_,
                                   local_a0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar4 * uVar5 + uVar13])
              ;
              uVar16 = uVar5 + 1;
              local_1a0 = (double)CONCAT44(local_1a0._4_4_,
                                           local_a0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [iVar4 * uVar16 + local_1b0._0_4_]);
              Logger();
              local_1d0.m_xpr = (Matrix<double,__1,_2,_0,__1,_2> *)0x355c7c;
              local_1d0.m_row = CONCAT44(local_1d0.m_row._4_4_,0x77);
              local_1d0.m_col = 0x355b80;
              loc_03._8_8_ = local_1d0.m_row;
              loc_03.filename =
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_triag_mesh_builder.cc"
              ;
              loc_03.funcname = "Build";
              fmt_03.size_ = 0x1b;
              fmt_03.data_ = "diagonal edge {}: {} <-> {}";
              spdlog::logger::log_<int&,unsigned_int_const&,unsigned_int_const&>
                        (Logger::logger.
                         super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         loc_03,trace,fmt_03,&local_1dc,(uint *)&local_1d8,(uint *)&local_1a0);
              local_1d0.m_xpr =
                   (Matrix<double,__1,_2,_0,__1,_2> *)CONCAT44(local_1a0._0_4_,(int)local_1d8);
              __l_01._M_len = 2;
              __l_01._M_array = (iterator)&local_1d0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_178,__l_01,(allocator_type *)&local_118);
              local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&local_118,2,2)
              ;
              local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)(*(double *)(in_RSI + 0x10) + local_1a8);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::CommaInitializer
                        (&local_1d0,(Matrix<double,__1,_2,_0,__1,_2> *)&local_118,
                         (Scalar *)&local_150);
              local_198.m_data = (double *)(*(double *)(in_RSI + 0x10) + local_128);
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                                 (&local_1d0,(Scalar *)&local_198);
              local_138.m_data = (double *)((double)uVar5 * local_e8 + *(double *)(in_RSI + 0x18));
              pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                                 (pCVar8,(Scalar *)&local_138);
              local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((double)uVar16 * local_e8 + *(double *)(in_RSI + 0x18));
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::operator_
                        (pCVar8,(Scalar *)&local_100);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_1d0)
              ;
              plVar1 = *(long **)(in_RSI + 8);
              local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)local_178.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_178.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
              local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pdVar9 = (double *)operator_new(0x18);
              Eigen::DenseStorage<double,_-1,_-1,_2,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_2,_0> *)&local_1d0,
                         (DenseStorage<double,__1,__1,_2,_0> *)&local_118);
              *pdVar9 = (double)local_180;
              pdVar9[1] = (double)local_1d0.m_xpr;
              pdVar9[2] = (double)local_1d0.m_row;
              local_198.m_data = pdVar9;
              uVar5 = (**(code **)(*plVar1 + 0x20))(plVar1,2,&local_150,&local_198);
              local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[local_1dc] = uVar5;
              if (local_198.m_data != (double *)0x0) {
                (**(code **)((long)*local_198.m_data + 0x58))();
              }
              free(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start);
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                operator_delete(local_178.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_178.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_178.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_1dc = local_1dc + 1;
              uVar5 = uVar16;
            } while ((uint)local_158 != uVar16);
          }
          uVar13 = local_1b0._0_4_;
        } while (local_1b0._0_4_ != (uint)local_160);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_178,(ulong)local_bc,(allocator_type *)&local_1d0);
      if ((uint)local_160 != 0) {
        uVar14 = 0;
        local_1b0 = 0.0;
        do {
          uVar15 = (ulong)((int)uVar14 + 1);
          if ((uint)local_158 != 0) {
            local_1a8 = (double)uVar14 * local_78;
            local_128 = (double)uVar15 * local_78;
            local_68 = uVar15;
            local_60 = uVar14;
            uVar13 = 0;
            do {
              iVar4 = *(int *)(in_RSI + 0x30) + 1;
              local_180 = (undefined **)CONCAT44(local_180._4_4_,uVar13 + 1);
              iVar6 = iVar4 * (uVar13 + 1);
              local_1d0.m_xpr =
                   (Matrix<double,__1,_2,_0,__1,_2> *)
                   CONCAT44(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[(uint)(iVar6 + (int)local_68)]
                            ,local_a0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[iVar4 * uVar13 + (int)local_60]);
              local_1d0.m_row =
                   CONCAT44(local_1d0.m_row._4_4_,
                            local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[(uint)(iVar6 + (int)local_60)]
                           );
              __l_02._M_len = 3;
              __l_02._M_array = (iterator)&local_1d0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_118,__l_02,(allocator_type *)&local_150);
              local_198.m_data = (double *)0x0;
              local_198.m_rows = 0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&local_198,2,3)
              ;
              local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)(*(double *)(in_RSI + 0x10) + local_1a8);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::CommaInitializer
                        ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&local_1d0,
                         (Matrix<double,__1,_3,_0,__1,_3> *)&local_198,(Scalar *)&local_150);
              local_138.m_data = (double *)(*(double *)(in_RSI + 0x10) + local_128);
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)
                                   &local_1d0,(Scalar *)&local_138);
              local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (*(double *)(in_RSI + 0x10) + local_1a8);
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  (pCVar10,(Scalar *)&local_100);
              local_58 = (double)uVar13 * local_e8;
              local_1d8 = (TriaO1 *)(*(double *)(in_RSI + 0x18) + local_58);
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  (pCVar10,(Scalar *)&local_1d8);
              local_f0 = (undefined **)((double)((ulong)local_180 & 0xffffffff) * local_e8);
              local_1a0 = *(double *)(in_RSI + 0x18) + (double)local_f0;
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  (pCVar10,&local_1a0);
              local_d0 = *(double *)(in_RSI + 0x18) + (double)local_f0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                        (pCVar10,&local_d0);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::finished
                        ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&local_1d0);
              plVar1 = *(long **)(in_RSI + 8);
              local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((long)local_118.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_118.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
              local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pTVar11 = (TriaO1 *)operator_new(0x40);
              Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_3,_0> *)&local_1d0,&local_198);
              geometry::TriaO1::TriaO1(pTVar11,(Matrix<double,__1,_3,_0,__1,_3> *)&local_1d0);
              free(local_1d0.m_xpr);
              local_138.m_data = (double *)pTVar11;
              uVar7 = (**(code **)(*plVar1 + 0x20))(plVar1,3,&local_150,&local_138);
              *(undefined4 *)
               ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                        local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                       _M_start + ((ulong)local_1b0 & 0xffffffff) * 4) = uVar7;
              if ((TriaO1 *)local_138.m_data != (TriaO1 *)0x0) {
                (*((Geometry *)local_138.m_data)->_vptr_Geometry[0xb])();
              }
              iVar4 = *(int *)(in_RSI + 0x30) + 1;
              iVar6 = uVar13 * iVar4;
              local_1d0.m_xpr =
                   (Matrix<double,__1,_2,_0,__1,_2> *)
                   CONCAT44(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[(uint)(iVar6 + (int)local_68)]
                            ,local_a0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(uint)((int)local_60 + iVar6)]);
              local_1d0.m_row =
                   CONCAT44(local_1d0.m_row._4_4_,
                            local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [iVar4 * (uint)local_180 + (int)local_68]);
              __l_03._M_len = 3;
              __l_03._M_array = (iterator)&local_1d0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_150,__l_03,(allocator_type *)&local_138);
              local_138.m_data = (double *)0x0;
              local_138.m_rows = 0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&local_138,2,3)
              ;
              local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (*(double *)(in_RSI + 0x10) + local_1a8);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::CommaInitializer
                        ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&local_1d0,
                         (Matrix<double,__1,_3,_0,__1,_3> *)&local_138,(Scalar *)&local_100);
              local_1d8 = (TriaO1 *)(*(double *)(in_RSI + 0x10) + local_128);
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)
                                   &local_1d0,(Scalar *)&local_1d8);
              local_1a0 = *(double *)(in_RSI + 0x10) + local_128;
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  (pCVar10,&local_1a0);
              local_d0 = *(double *)(in_RSI + 0x18) + local_58;
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  (pCVar10,&local_d0);
              local_38 = local_58 + *(double *)(in_RSI + 0x18);
              pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                                  (pCVar10,&local_38);
              local_40 = (double)local_f0 + *(double *)(in_RSI + 0x18);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::operator_
                        (pCVar10,&local_40);
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::finished
                        ((CommaInitializer<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&local_1d0);
              pTVar11 = (TriaO1 *)operator_new(0x40);
              Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_3,_0> *)&local_1d0,&local_138);
              geometry::TriaO1::TriaO1(pTVar11,(Matrix<double,__1,_3,_0,__1,_3> *)&local_1d0);
              free(local_1d0.m_xpr);
              plVar1 = *(long **)(in_RSI + 8);
              local_f8 = (long)local_150.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_150.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
              local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              this_00 = (TriaO1 *)operator_new(0x40);
              Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_3,_0> *)&local_1d0,&local_138);
              geometry::TriaO1::TriaO1(this_00,(Matrix<double,__1,_3,_0,__1,_3> *)&local_1d0);
              free(local_1d0.m_xpr);
              local_1d8 = this_00;
              uVar7 = (**(code **)(*plVar1 + 0x20))(plVar1,3,&local_100,&local_1d8);
              *(undefined4 *)
               ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                        local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                       _M_start + (ulong)(SUB84(local_1b0,0) + 1) * 4) = uVar7;
              if (local_1d8 != (TriaO1 *)0x0) {
                (*(local_1d8->super_Geometry)._vptr_Geometry[0xb])();
              }
              (*(pTVar11->super_Geometry)._vptr_Geometry[0xb])(pTVar11);
              free(local_138.m_data);
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                operator_delete(local_150.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_150.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_150.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              free(local_198.m_data);
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                operator_delete(local_118.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_1b0 = (double)(ulong)(SUB84(local_1b0,0) + 2);
              uVar15 = local_68;
              uVar13 = (uint)local_180;
            } while ((uint)local_158 != (uint)local_180);
          }
          uVar14 = uVar15 & 0xffffffff;
        } while ((int)uVar15 != (uint)local_160);
      }
      this = local_50;
      (**(code **)(**(long **)(in_RSI + 8) + 0x28))(local_50);
      _Var12._M_pi = extraout_RDX_00;
      if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        operator_delete(local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var12._M_pi = extraout_RDX_01;
      }
      if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var12._M_pi = extraout_RDX_02;
      }
      if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var12._M_pi = extraout_RDX_03;
      }
    }
    else {
      (this->super_StructuredMeshBuilder)._vptr_StructuredMeshBuilder = (_func_int **)0x0;
      (this->super_StructuredMeshBuilder).mesh_factory_._M_t.
      super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t
      .super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
      super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
    }
  }
  sVar17.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  sVar17.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<lf::mesh::Mesh>)
         sVar17.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<mesh::Mesh> TPTriagMeshBuilder::Build() {
  using coord_t = Eigen::Vector2d;
  const size_type nx = num_of_x_cells_;
  const size_type ny = num_of_y_cells_;
  // Total number of entities in the mesh
  // Each square is split into two triangles
  const unsigned no_of_cells = 2 * nx * ny;
  const unsigned no_of_edges = nx * ny + (nx + 1) * ny + nx * (ny + 1);
  const unsigned no_of_vertices = (nx + 1) * (ny + 1);
  // Diagnostics
  SPDLOG_LOGGER_DEBUG(Logger(), "TPmesh: {} cells, {} edges, {} vertices",
                      no_of_cells, no_of_edges, no_of_vertices);

  // No mesh to build
  if (no_of_cells == 0) {
    return nullptr;
  }
  // define rectangle; return if none
  const double x_size = top_right_corner_[0] - bottom_left_corner_[0];
  const double y_size = top_right_corner_[1] - bottom_left_corner_[1];
  if ((x_size <= 0.0) || (y_size <= 0.0)) {
    return nullptr;
  }
  // meshwidths
  const double hx = x_size / nx;
  const double hy = y_size / ny;

  // Initialize vertices
  std::vector<size_type> v_idx(no_of_vertices);
  int node_cnt = 0;  // index of current vertex: lexicographic numbering
  for (size_type j = 0; j <= ny; ++j) {
    for (size_type i = 0; i <= nx; ++i, ++node_cnt) {
      // Tensor-product node locations
      coord_t node_coord(2);
      node_coord << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[1] + j * hy;
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "Adding vertex {}: {}", node_cnt,
                          node_coord.transpose());

      // Enlist vertex
      v_idx[node_cnt] = mesh_factory_->AddPoint(node_coord);
    }
  }

  // Initialize edges
  // Just in case of index permutations
  std::vector<size_type> e_idx(no_of_edges);
  int edge_cnt = 0;  // index of current edge
  // First horizontal edges
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j <= ny; ++j, ++edge_cnt) {
      // Indices of the two endpoints of the edge
      auto first_endpoint_idx = v_idx[VertexIndex(i, j)];
      auto second_endpoint_idx = v_idx[VertexIndex(i + 1, j)];
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "horizontal edge {}: {} <-> {}", edge_cnt,
                          first_endpoint_idx, second_endpoint_idx);

      std::vector<size_type> nodes_index_list{first_endpoint_idx,
                                              second_endpoint_idx};
      // Coordinates of endpoints a columns of a 2x2 matrix
      Eigen::Matrix<double, Eigen::Dynamic, 2> edge_geo(2, 2);
      edge_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[1] + j * hy, bottom_left_corner_[1] + j * hy;
      e_idx[edge_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kSegment(), nodes_index_list,
          std::make_unique<geometry::SegmentO1>(edge_geo));
    }
  }
  // Next vertical edges
  for (size_type i = 0; i <= nx; ++i) {
    for (size_type j = 0; j < ny; ++j, ++edge_cnt) {
      // Indices of the two endpoints of the edge
      const size_type first_endpoint_idx = v_idx[VertexIndex(i, j)];
      const size_type second_endpoint_idx = v_idx[VertexIndex(i, j + 1)];
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "vertical edge {}: {} <-> {}", edge_cnt,
                          first_endpoint_idx, second_endpoint_idx);

      std::vector<size_type> nodes_index_list{first_endpoint_idx,
                                              second_endpoint_idx};
      // Coordinates of endpoints a columns of a 2x2 matrix
      Eigen::Matrix<double, Eigen::Dynamic, 2> edge_geo(2, 2);
      edge_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + i * hx, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      e_idx[edge_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kSegment(), nodes_index_list,
          std::make_unique<geometry::SegmentO1>(edge_geo));
    }
  }
  // Then the skew edges (diagonals of squares)
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j < ny; ++j, ++edge_cnt) {
      // Indices of the two endpoints of the edge
      const size_type first_endpoint_idx = v_idx[VertexIndex(i, j)];
      const size_type second_endpoint_idx = v_idx[VertexIndex(i + 1, j + 1)];
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "diagonal edge {}: {} <-> {}", edge_cnt,
                          first_endpoint_idx, second_endpoint_idx);

      std::vector<size_type> nodes_index_list{first_endpoint_idx,
                                              second_endpoint_idx};
      // Coordinates of endpoints a columns of a 2x2 matrix
      Eigen::Matrix<double, Eigen::Dynamic, 2> edge_geo(2, 2);
      edge_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      e_idx[edge_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kSegment(), nodes_index_list,
          std::make_unique<geometry::SegmentO1>(edge_geo));
    }
  }

  // Finally initialize the triangles
  // Index remapping for triangles
  std::vector<size_type> t_idx(no_of_cells);

  size_type tria_cnt = 0;  // index of current triangle
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j < ny; ++j, tria_cnt += 2) {
      // Triangle above the diagonal
      // Indices of the vertices
      std::vector<size_type> vertex_index_list_up{
          v_idx[VertexIndex(i, j)], v_idx[VertexIndex(i + 1, j + 1)],
          v_idx[VertexIndex(i, j + 1)]};
      // Construct geometry
      Eigen::Matrix<double, Eigen::Dynamic, 3> tria_geo_up(2, 3);
      tria_geo_up << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + i * hx, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      // Enroll the triangle entity
      t_idx[tria_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kTria(), vertex_index_list_up,
          std::make_unique<geometry::TriaO1>(tria_geo_up));
      // Triangle below the diagonal
      // Indices of the vertices
      std::vector<size_type> vertex_index_list_low{
          v_idx[VertexIndex(i, j)], v_idx[VertexIndex(i + 1, j)],
          v_idx[VertexIndex(i + 1, j + 1)]};
      // Construct geometry
      Eigen::Matrix<double, Eigen::Dynamic, 3> tria_geo_low(2, 3);
      tria_geo_low << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[1] + j * hy, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      auto tria_geo_low_ptr = std::make_unique<geometry::TriaO1>(tria_geo_low);
      // Generate the triangle entity
      t_idx[tria_cnt + 1] = mesh_factory_->AddEntity(
          lf::base::RefEl::kTria(), vertex_index_list_low,
          std::make_unique<geometry::TriaO1>(tria_geo_low));
    }
  }
  return mesh_factory_->Build();
}